

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::NavUpdateCreateMoveRequest(void)

{
  ImGuiContext *pIVar1;
  ImRect IVar2;
  bool bVar3;
  float fVar4;
  ImRect IVar5;
  ImRect nav_rect_rel;
  ImRect scoring_rect;
  float pad_y;
  float pad_x;
  ImRect inner_rect_rel;
  bool clamp_y;
  bool clamp_x;
  float scoring_rect_offset_y;
  bool nav_keyboard_active;
  ImGuiInputReadMode read_mode;
  ImGuiWindow *window;
  ImGuiIO *io;
  ImGuiContext *g;
  ImGuiScrollFlags in_stack_fffffffffffffef8;
  ImGuiNavMoveFlags in_stack_fffffffffffffefc;
  float in_stack_ffffffffffffff00;
  float in_stack_ffffffffffffff04;
  float in_stack_ffffffffffffff08;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  ImRect *r;
  ImRect *this;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImRect local_90;
  float local_80;
  float local_7c;
  ImVec2 local_78;
  ImVec2 local_70;
  ImRect local_68;
  ImRect local_58;
  ImRect local_48;
  byte local_36;
  byte local_35;
  float local_34;
  undefined1 local_2d;
  ImVec2 local_2c;
  ImVec2 local_24;
  undefined4 local_1c;
  ImGuiWindow *local_18;
  ImGuiIO *local_10;
  ImGuiContext *local_8;
  
  pIVar1 = GImGui;
  local_8 = GImGui;
  local_10 = &GImGui->IO;
  local_18 = GImGui->NavWindow;
  if (((GImGui->NavMoveForwardToNextFrame & 1U) == 0) || (local_18 == (ImGuiWindow *)0x0)) {
    GImGui->NavMoveDir = -1;
    pIVar1->NavMoveFlags = 0;
    pIVar1->NavMoveScrollFlags = 0;
    if ((local_18 != (ImGuiWindow *)0x0) &&
       ((pIVar1->NavWindowingTarget == (ImGuiWindow *)0x0 && ((local_18->Flags & 0x40000U) == 0))))
    {
      local_1c = 3;
      bVar3 = IsActiveIdUsingNavDir(0);
      if ((!bVar3) &&
         ((bVar3 = IsNavInputTest(0,0x13f86b), bVar3 || (bVar3 = IsNavInputTest(0,0x13f87e), bVar3))
         )) {
        local_8->NavMoveDir = 0;
      }
      bVar3 = IsActiveIdUsingNavDir(1);
      if ((!bVar3) &&
         ((bVar3 = IsNavInputTest(0,0x13f8b3), bVar3 || (bVar3 = IsNavInputTest(0,0x13f8c6), bVar3))
         )) {
        local_8->NavMoveDir = 1;
      }
      bVar3 = IsActiveIdUsingNavDir(2);
      if ((!bVar3) &&
         ((bVar3 = IsNavInputTest(0,0x13f8fb), bVar3 || (bVar3 = IsNavInputTest(0,0x13f90e), bVar3))
         )) {
        local_8->NavMoveDir = 2;
      }
      bVar3 = IsActiveIdUsingNavDir(3);
      if ((!bVar3) &&
         ((bVar3 = IsNavInputTest(0,0x13f943), bVar3 || (bVar3 = IsNavInputTest(0,0x13f956), bVar3))
         )) {
        local_8->NavMoveDir = 3;
      }
    }
    local_8->NavMoveClipDir = local_8->NavMoveDir;
    ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                   in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                   in_stack_ffffffffffffff00);
    (local_8->NavScoringNoClipRect).Min = local_2c;
    (local_8->NavScoringNoClipRect).Max = local_24;
  }
  local_2d = (local_10->ConfigFlags & 1U) != 0;
  local_34 = 0.0;
  if (((local_18 != (ImGuiWindow *)0x0) && (local_8->NavMoveDir == -1)) && ((bool)local_2d)) {
    local_34 = NavUpdatePageUpPageDown();
  }
  if ((local_34 != 0.0) || (NAN(local_34))) {
    (local_8->NavScoringNoClipRect).Min = (local_18->InnerRect).Min;
    (local_8->NavScoringNoClipRect).Max = (local_18->InnerRect).Max;
    ImRect::TranslateY(&local_8->NavScoringNoClipRect,local_34);
  }
  local_8->NavMoveForwardToNextFrame = false;
  if (local_8->NavMoveDir != -1) {
    NavMoveRequestSubmit
              ((ImGuiDir)in_stack_ffffffffffffff04,(ImGuiDir)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffefc,in_stack_fffffffffffffef8);
  }
  if (((local_8->NavMoveSubmitted & 1U) != 0) && (local_8->NavId == 0)) {
    local_8->NavInitRequestFromMove = true;
    local_8->NavInitRequest = true;
    local_8->NavInitResultId = 0;
    local_8->NavDisableHighlight = false;
  }
  if (((((local_8->NavMoveSubmitted & 1U) != 0) &&
       (local_8->NavInputSource == ImGuiInputSource_Gamepad)) &&
      (local_8->NavLayer == ImGuiNavLayer_Main)) && (local_18 != (ImGuiWindow *)0x0)) {
    local_35 = (local_8->NavMoveFlags & 5U) == 0;
    local_36 = (local_8->NavMoveFlags & 10U) == 0;
    r = &local_18->InnerRect;
    this = &local_68;
    ImVec2::ImVec2(&this->Min,1.0,1.0);
    local_68.Max = operator-((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8)
                             ,(ImVec2 *)0x13fc15);
    ImVec2::ImVec2(&local_78,1.0,1.0);
    local_70 = operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                         (ImVec2 *)0x13fc5b);
    ImRect::ImRect(&local_58,&local_68.Max,&local_70);
    local_48 = WindowRectAbsToRel((ImGuiWindow *)
                                  CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                                  (ImRect *)
                                  CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    if ((((local_35 & 1) != 0) || ((local_36 & 1) != 0)) &&
       (bVar3 = ImRect::Contains(&local_48,local_18->NavRectRel + local_8->NavLayer), !bVar3)) {
      in_stack_ffffffffffffff10 = ImRect::GetWidth(&local_48);
      fVar4 = ImGuiWindow::CalcFontSize(local_18);
      local_7c = ImMin<float>(in_stack_ffffffffffffff10,fVar4 * 0.5);
      in_stack_ffffffffffffff14 = ImRect::GetHeight(&local_48);
      fVar4 = ImGuiWindow::CalcFontSize(local_18);
      local_80 = ImMin<float>(in_stack_ffffffffffffff14,fVar4 * 0.5);
      IVar5 = local_48;
      if ((local_35 & 1) == 0) {
        in_stack_ffffffffffffff0c = -3.4028235e+38;
      }
      else {
        in_stack_ffffffffffffff0c = local_48.Min.x + local_7c;
      }
      local_48.Min.x = in_stack_ffffffffffffff0c;
      IVar2 = local_48;
      if ((local_35 & 1) == 0) {
        in_stack_ffffffffffffff08 = 3.4028235e+38;
      }
      else {
        local_48.Max.x = IVar5.Max.x;
        in_stack_ffffffffffffff08 = local_48.Max.x - local_7c;
      }
      local_48.Max.y = IVar5.Max.y;
      fVar4 = local_48.Max.y;
      local_48.Min = IVar2.Min;
      local_48.Max.x = in_stack_ffffffffffffff08;
      IVar2 = local_48;
      if ((local_36 & 1) == 0) {
        in_stack_ffffffffffffff04 = -3.4028235e+38;
      }
      else {
        local_48.Min.y = IVar5.Min.y;
        in_stack_ffffffffffffff04 = local_48.Min.y + local_80;
      }
      local_48.Max = IVar2.Max;
      local_48.Min.y = in_stack_ffffffffffffff04;
      if ((local_36 & 1) == 0) {
        in_stack_ffffffffffffff00 = 3.4028235e+38;
      }
      else {
        in_stack_ffffffffffffff00 = fVar4 - local_80;
      }
      local_48.Max.y = in_stack_ffffffffffffff00;
      ImRect::ClipWithFull(this,r);
      local_8->NavFocusScopeId = 0;
      local_8->NavId = 0;
    }
  }
  ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00));
  if (local_18 != (ImGuiWindow *)0x0) {
    bVar3 = ImRect::IsInverted(local_18->NavRectRel + local_8->NavLayer);
    if (bVar3) {
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                     in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08,in_stack_ffffffffffffff04,
                     in_stack_ffffffffffffff00);
    }
    IVar5 = WindowRectRelToAbs((ImGuiWindow *)
                               CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),
                               (ImRect *)
                               CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    local_b0 = IVar5.Min;
    local_90.Min = local_b0;
    local_a8 = IVar5.Max;
    local_90.Max = local_a8;
    ImRect::TranslateY(&local_90,local_34);
    fVar4 = ImMin<float>(local_90.Min.x + 1.0,local_90.Max.x);
    local_90.Min.x = fVar4;
    local_90.Max.x = fVar4;
  }
  (local_8->NavScoringRect).Min = local_90.Min;
  (local_8->NavScoringRect).Max = local_90.Max;
  ImRect::Add(&local_8->NavScoringNoClipRect,&local_90);
  return;
}

Assistant:

void ImGui::NavUpdateCreateMoveRequest()
{
    ImGuiContext& g = *GImGui;
    ImGuiIO& io = g.IO;
    ImGuiWindow* window = g.NavWindow;

    if (g.NavMoveForwardToNextFrame && window != NULL)
    {
        // Forwarding previous request (which has been modified, e.g. wrap around menus rewrite the requests with a starting rectangle at the other side of the window)
        // (preserve most state, which were already set by the NavMoveRequestForward() function)
        IM_ASSERT(g.NavMoveDir != ImGuiDir_None && g.NavMoveClipDir != ImGuiDir_None);
        IM_ASSERT(g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded);
        IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequestForward %d\n", g.NavMoveDir);
    }
    else
    {
        // Initiate directional inputs request
        g.NavMoveDir = ImGuiDir_None;
        g.NavMoveFlags = ImGuiNavMoveFlags_None;
        g.NavMoveScrollFlags = ImGuiScrollFlags_None;
        if (window && !g.NavWindowingTarget && !(window->Flags & ImGuiWindowFlags_NoNavInputs))
        {
            const ImGuiInputReadMode read_mode = ImGuiInputReadMode_Repeat;
            if (!IsActiveIdUsingNavDir(ImGuiDir_Left)  && (IsNavInputTest(ImGuiNavInput_DpadLeft,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyLeft_,  read_mode))) { g.NavMoveDir = ImGuiDir_Left; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Right) && (IsNavInputTest(ImGuiNavInput_DpadRight, read_mode) || IsNavInputTest(ImGuiNavInput_KeyRight_, read_mode))) { g.NavMoveDir = ImGuiDir_Right; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Up)    && (IsNavInputTest(ImGuiNavInput_DpadUp,    read_mode) || IsNavInputTest(ImGuiNavInput_KeyUp_,    read_mode))) { g.NavMoveDir = ImGuiDir_Up; }
            if (!IsActiveIdUsingNavDir(ImGuiDir_Down)  && (IsNavInputTest(ImGuiNavInput_DpadDown,  read_mode) || IsNavInputTest(ImGuiNavInput_KeyDown_,  read_mode))) { g.NavMoveDir = ImGuiDir_Down; }
        }
        g.NavMoveClipDir = g.NavMoveDir;
        g.NavScoringNoClipRect = ImRect(+FLT_MAX, +FLT_MAX, -FLT_MAX, -FLT_MAX);
    }

    // Update PageUp/PageDown/Home/End scroll
    // FIXME-NAV: Consider enabling those keys even without the master ImGuiConfigFlags_NavEnableKeyboard flag?
    const bool nav_keyboard_active = (io.ConfigFlags & ImGuiConfigFlags_NavEnableKeyboard) != 0;
    float scoring_rect_offset_y = 0.0f;
    if (window && g.NavMoveDir == ImGuiDir_None && nav_keyboard_active)
        scoring_rect_offset_y = NavUpdatePageUpPageDown();
    if (scoring_rect_offset_y != 0.0f)
    {
        g.NavScoringNoClipRect = window->InnerRect;
        g.NavScoringNoClipRect.TranslateY(scoring_rect_offset_y);
    }

    // [DEBUG] Always send a request
#if IMGUI_DEBUG_NAV_SCORING
    if (io.KeyCtrl && IsKeyPressed(ImGuiKey_C))
        g.NavMoveDirForDebug = (ImGuiDir)((g.NavMoveDirForDebug + 1) & 3);
    if (io.KeyCtrl && g.NavMoveDir == ImGuiDir_None)
    {
        g.NavMoveDir = g.NavMoveDirForDebug;
        g.NavMoveFlags |= ImGuiNavMoveFlags_DebugNoResult;
    }
#endif

    // Submit
    g.NavMoveForwardToNextFrame = false;
    if (g.NavMoveDir != ImGuiDir_None)
        NavMoveRequestSubmit(g.NavMoveDir, g.NavMoveClipDir, g.NavMoveFlags, g.NavMoveScrollFlags);

    // Moving with no reference triggers a init request (will be used as a fallback if the direction fails to find a match)
    if (g.NavMoveSubmitted && g.NavId == 0)
    {
        IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: from move, window \"%s\", layer=%d\n", g.NavWindow->Name, g.NavLayer);
        g.NavInitRequest = g.NavInitRequestFromMove = true;
        g.NavInitResultId = 0;
        g.NavDisableHighlight = false;
    }

    // When using gamepad, we project the reference nav bounding box into window visible area.
    // This is to allow resuming navigation inside the visible area after doing a large amount of scrolling, since with gamepad every movements are relative
    // (can't focus a visible object like we can with the mouse).
    if (g.NavMoveSubmitted && g.NavInputSource == ImGuiInputSource_Gamepad && g.NavLayer == ImGuiNavLayer_Main && window != NULL)// && (g.NavMoveFlags & ImGuiNavMoveFlags_Forwarded))
    {
        bool clamp_x = (g.NavMoveFlags & (ImGuiNavMoveFlags_LoopX | ImGuiNavMoveFlags_WrapX)) == 0;
        bool clamp_y = (g.NavMoveFlags & (ImGuiNavMoveFlags_LoopY | ImGuiNavMoveFlags_WrapY)) == 0;
        ImRect inner_rect_rel = WindowRectAbsToRel(window, ImRect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1)));
        if ((clamp_x || clamp_y) && !inner_rect_rel.Contains(window->NavRectRel[g.NavLayer]))
        {
            IMGUI_DEBUG_LOG_NAV("[nav] NavMoveRequest: clamp NavRectRel for gamepad move\n");
            float pad_x = ImMin(inner_rect_rel.GetWidth(), window->CalcFontSize() * 0.5f);
            float pad_y = ImMin(inner_rect_rel.GetHeight(), window->CalcFontSize() * 0.5f); // Terrible approximation for the intent of starting navigation from first fully visible item
            inner_rect_rel.Min.x = clamp_x ? (inner_rect_rel.Min.x + pad_x) : -FLT_MAX;
            inner_rect_rel.Max.x = clamp_x ? (inner_rect_rel.Max.x - pad_x) : +FLT_MAX;
            inner_rect_rel.Min.y = clamp_y ? (inner_rect_rel.Min.y + pad_y) : -FLT_MAX;
            inner_rect_rel.Max.y = clamp_y ? (inner_rect_rel.Max.y - pad_y) : +FLT_MAX;
            window->NavRectRel[g.NavLayer].ClipWithFull(inner_rect_rel);
            g.NavId = g.NavFocusScopeId = 0;
        }
    }

    // For scoring we use a single segment on the left side our current item bounding box (not touching the edge to avoid box overlap with zero-spaced items)
    ImRect scoring_rect;
    if (window != NULL)
    {
        ImRect nav_rect_rel = !window->NavRectRel[g.NavLayer].IsInverted() ? window->NavRectRel[g.NavLayer] : ImRect(0, 0, 0, 0);
        scoring_rect = WindowRectRelToAbs(window, nav_rect_rel);
        scoring_rect.TranslateY(scoring_rect_offset_y);
        scoring_rect.Min.x = ImMin(scoring_rect.Min.x + 1.0f, scoring_rect.Max.x);
        scoring_rect.Max.x = scoring_rect.Min.x;
        IM_ASSERT(!scoring_rect.IsInverted()); // Ensure if we have a finite, non-inverted bounding box here will allows us to remove extraneous ImFabs() calls in NavScoreItem().
        //GetForegroundDrawList()->AddRect(scoring_rect.Min, scoring_rect.Max, IM_COL32(255,200,0,255)); // [DEBUG]
        //if (!g.NavScoringNoClipRect.IsInverted()) { GetForegroundDrawList()->AddRect(g.NavScoringNoClipRect.Min, g.NavScoringNoClipRect.Max, IM_COL32(255, 200, 0, 255)); } // [DEBUG]
    }
    g.NavScoringRect = scoring_rect;
    g.NavScoringNoClipRect.Add(scoring_rect);
}